

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O1

gravity_value_t convert_value2string(gravity_vm *vm,gravity_value_t v)

{
  _Bool _Var1;
  gravity_class_t *c;
  gravity_closure_t *closure;
  gravity_closure_t *pgVar2;
  char *pcVar3;
  gravity_delegate_t *pgVar4;
  uint32_t *s;
  uint32_t len;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 list_00;
  char *pcVar5;
  gravity_list_t *list;
  gravity_class_t *pgVar6;
  bool bVar7;
  gravity_value_t gVar8;
  char buffer [512];
  uint32_t local_228 [128];
  
  list_00 = v.field_1;
  pgVar6 = v.isa;
  s = local_228;
  if (gravity_class_string == pgVar6) {
    return v;
  }
  if (gravity_class_int == pgVar6) {
    pcVar5 = "%ld";
LAB_0011640a:
    snprintf((char *)local_228,0x200,pcVar5,list_00.n);
    pcVar5 = (char *)local_228;
    goto LAB_001165b7;
  }
  if (gravity_class_bool == pgVar6) {
    pcVar5 = "true";
    if ((gravity_list_t *)list_00.n == (gravity_list_t *)0x0) {
      pcVar5 = "false";
    }
    goto LAB_001165b7;
  }
  if (((ulong)gravity_class_null ^ (ulong)pgVar6) == 0 &&
      (gravity_list_t *)list_00.n == (gravity_list_t *)0x0) {
LAB_001163f7:
    pcVar5 = "null";
    goto LAB_001165b7;
  }
  if (((ulong)gravity_class_null ^ (ulong)pgVar6) == 0 &&
      (gravity_list_t *)list_00.n == (gravity_list_t *)0x1) {
    pcVar5 = "undefined";
    goto LAB_001165b7;
  }
  if (gravity_class_float == pgVar6) {
    snprintf((char *)local_228,0x200,"%g",list_00.n);
    pcVar5 = (char *)local_228;
    goto LAB_001165b7;
  }
  if (gravity_class_class == pgVar6) {
    pcVar3 = (list_00.p)->identifier;
    bVar7 = pcVar3 == (char *)0x0;
    pcVar5 = "anonymous class";
  }
  else if (gravity_class_function == pgVar6) {
    pcVar3 = (list_00.p)->identifier;
    bVar7 = pcVar3 == (char *)0x0;
    pcVar5 = "anonymous func";
  }
  else {
    if (gravity_class_closure != pgVar6) {
      if (gravity_class_list == pgVar6) {
        gVar8 = convert_list2string(vm,(gravity_list_t *)list_00.p);
        return gVar8;
      }
      if (gravity_class_map == pgVar6) {
        gVar8 = convert_map2string(vm,(gravity_map_t *)list_00.p);
        return gVar8;
      }
      if (gravity_class_range == pgVar6) {
        snprintf((char *)local_228,0x200,"%ld...%ld",((gravity_value_r *)&(list_00.p)->objclass)->n,
                 (list_00.p)->identifier);
        pcVar5 = (char *)local_228;
        goto LAB_001165b7;
      }
      if (gravity_class_fiber == pgVar6) {
        pcVar5 = "Fiber %p";
        goto LAB_0011640a;
      }
      c = gravity_value_getclass(v);
      closure = gravity_vm_fastlookup(vm,c,0x1c);
      if ((closure != (gravity_closure_t *)0x0) &&
         (((closure->f->tag != EXEC_TYPE_INTERNAL ||
           ((code *)(closure->f->field_9).field_0.cpool.n != convert_object_string)) &&
          (pgVar2 = gravity_vm_getclosure(vm), pgVar2 != closure)))) {
        _Var1 = gravity_vm_runclosure(vm,closure,v,(gravity_value_t *)0x0,0);
        if (!_Var1) {
          return (gravity_value_t)ZEXT816(0);
        }
        gVar8 = gravity_vm_result(vm);
        if (gVar8.isa == gravity_class_string) {
          return gVar8;
        }
        goto LAB_001163f7;
      }
      if (gravity_class_instance != pgVar6) goto LAB_001166d4;
      if ((vm == (gravity_vm *)0x0) || ((list_00.p)->identifier == (char *)0x0)) {
        pcVar5 = *(char **)(((gravity_value_r *)&(list_00.p)->objclass)->n + 0x38);
        pcVar3 = "anonymous class";
        if (pcVar5 != (char *)0x0) {
          pcVar3 = pcVar5;
        }
        bVar7 = false;
        snprintf((char *)local_228,0x200,"instance of %s (%p)",pcVar3,list_00.n);
        len = 0xffffffff;
LAB_001166bb:
        v = gravity_string_to_value(vm,(char *)s,len);
      }
      else {
        pgVar4 = gravity_vm_delegate(vm);
        if (pgVar4->bridge_string == (gravity_bridge_string)0x0) {
          bVar7 = true;
        }
        else {
          local_228[0] = 0;
          s = (uint32_t *)(*pgVar4->bridge_string)(vm,(list_00.p)->identifier,local_228);
          bVar7 = s == (uint32_t *)0x0;
          len = local_228[0];
          if (!bVar7) goto LAB_001166bb;
        }
      }
      if (!bVar7) {
        return v;
      }
LAB_001166d4:
      return (gravity_value_t)ZEXT816(0);
    }
    pcVar3 = *(char **)((list_00.p)->identifier + 0x38);
    bVar7 = pcVar3 == (char *)0x0;
    pcVar5 = "anonymous closure";
  }
  if (!bVar7) {
    pcVar5 = pcVar3;
  }
LAB_001165b7:
  gVar8 = gravity_string_to_value(vm,pcVar5,0xffffffff);
  return gVar8;
}

Assistant:

inline gravity_value_t convert_value2string (gravity_vm *vm, gravity_value_t v) {
    if (VALUE_ISA_STRING(v)) return v;

    // handle conversion for basic classes
    if (VALUE_ISA_INT(v)) {
        char buffer[512];
        #if GRAVITY_ENABLE_INT64
        snprintf(buffer, sizeof(buffer), "%" PRId64, v.n);
        #else
        snprintf(buffer, sizeof(buffer), "%d", v.n);
        #endif
        return VALUE_FROM_CSTRING(vm, buffer);

    }
    if (VALUE_ISA_BOOL(v)) return VALUE_FROM_CSTRING(vm, (v.n) ? "true" : "false");
    if (VALUE_ISA_NULL(v)) return VALUE_FROM_CSTRING(vm, "null");
    if (VALUE_ISA_UNDEFINED(v)) return VALUE_FROM_CSTRING(vm, "undefined");
    
    if (VALUE_ISA_FLOAT(v)) {
        char buffer[512];
        snprintf(buffer, sizeof(buffer), "%g", v.f);
        return VALUE_FROM_CSTRING(vm, buffer);
    }

    if (VALUE_ISA_CLASS(v)) {
        const char *identifier = (VALUE_AS_CLASS(v)->identifier);
        if (!identifier) identifier = "anonymous class";
        return VALUE_FROM_CSTRING(vm, identifier);
    }

    if (VALUE_ISA_FUNCTION(v)) {
        const char *identifier = (VALUE_AS_FUNCTION(v)->identifier);
        if (!identifier) identifier = "anonymous func";
        return VALUE_FROM_CSTRING(vm, identifier);
    }

    if (VALUE_ISA_CLOSURE(v)) {
        const char *identifier = (VALUE_AS_CLOSURE(v)->f->identifier);
        if (!identifier) identifier = "anonymous closure";
        return VALUE_FROM_CSTRING(vm, identifier);
    }

    if (VALUE_ISA_LIST(v)) {
        gravity_list_t *list = VALUE_AS_LIST(v);
        return convert_list2string(vm, list);
    }

    if (VALUE_ISA_MAP(v)) {
        gravity_map_t *map = VALUE_AS_MAP(v);
        return convert_map2string(vm, map);
    }

    if (VALUE_ISA_RANGE(v)) {
        gravity_range_t *r = VALUE_AS_RANGE(v);
        char buffer[512];
        snprintf(buffer, sizeof(buffer), "%" PRId64 "...%" PRId64, r->from, r->to);
        return VALUE_FROM_CSTRING(vm, buffer);
    }
    
    if (VALUE_ISA_FIBER(v)) {
        char buffer[512];
        snprintf(buffer, sizeof(buffer), "Fiber %p", VALUE_AS_OBJECT(v));
        return VALUE_FROM_CSTRING(vm, buffer);
    }
    
    // check if class implements the String method (avoiding infinite loop by checking for convert_object_string)
    gravity_closure_t *closure = gravity_vm_fastlookup(vm, gravity_value_getclass(v), GRAVITY_STRING_INDEX);

    // sanity check (and break recursion)
    if ((!closure) || ((closure->f->tag == EXEC_TYPE_INTERNAL) && (closure->f->internal == convert_object_string)) || gravity_vm_getclosure(vm) == closure) {
		if (VALUE_ISA_INSTANCE(v)) {
			gravity_instance_t *instance = VALUE_AS_INSTANCE(v);
			if (vm && instance->xdata) {
				gravity_delegate_t *delegate = gravity_vm_delegate(vm);
				if (delegate->bridge_string) {
					uint32_t len = 0;
					const char *s = delegate->bridge_string(vm, instance->xdata, &len);
					if (s) return VALUE_FROM_STRING(vm, s, len);
				}
			} else {
				char buffer[512];
                const char *identifier = (instance->objclass->identifier);
                if (!identifier) identifier = "anonymous class";
                snprintf(buffer, sizeof(buffer), "instance of %s (%p)", identifier, instance);
                return VALUE_FROM_CSTRING(vm, buffer);
            }
        }
        return VALUE_FROM_ERROR(NULL);
    }

    // execute closure and return its value
    if (gravity_vm_runclosure(vm, closure, v, NULL, 0)) {
        gravity_value_t result = gravity_vm_result(vm);
        // sanity check closure return value because sometimes nil is returned by an objc instance (for example NSData String)
        if (!VALUE_ISA_STRING(result)) return VALUE_FROM_CSTRING(vm, "null");
        return result;
    }

    return VALUE_FROM_ERROR(NULL);
}